

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

uint32 re2::hashword(uint32 *k,size_t length,uint32 initval)

{
  uint uVar1;
  int iVar2;
  uint32 uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  uVar1 = initval + (int)length * 4 + 0xdeadbeef;
  uVar6 = uVar1;
  uVar4 = uVar1;
  if (3 < length) {
    do {
      uVar1 = uVar1 + k[2];
      uVar4 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar4 + *k) - uVar1;
      iVar2 = uVar1 + uVar6 + k[1];
      uVar6 = (uVar4 << 6 | uVar4 >> 0x1a) ^ (uVar6 + k[1]) - uVar4;
      iVar5 = uVar4 + iVar2;
      uVar1 = (uVar6 << 8 | uVar6 >> 0x18) ^ iVar2 - uVar6;
      iVar2 = uVar6 + iVar5;
      uVar4 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar5 - uVar1;
      iVar5 = uVar1 + iVar2;
      uVar6 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar2 - uVar4;
      uVar4 = uVar4 + iVar5;
      uVar1 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar5 - uVar6;
      uVar6 = uVar6 + uVar4;
      length = length - 3;
      k = k + 3;
    } while (3 < length);
  }
  uVar3 = (*(code *)(&DAT_0015a600 + *(int *)(&DAT_0015a600 + length * 4)))
                    (k,&DAT_0015a600 + *(int *)(&DAT_0015a600 + length * 4),uVar4,uVar6);
  return uVar3;
}

Assistant:

uint32 hashword(
const uint32 *k,                   /* the key, an array of uint32_t values */
size_t          length,               /* the length of the key, in uint32_ts */
uint32        initval)         /* the previous hash, or an arbitrary value */
{
  uint32_t a,b,c;

  /* Set up the internal state */
  a = b = c = 0xdeadbeef + (((uint32_t)length)<<2) + initval;

  /*------------------------------------------------- handle most of the key */
  while (length > 3)
  {
    a += k[0];
    b += k[1];
    c += k[2];
    mix(a,b,c);
    length -= 3;
    k += 3;
  }

  /*------------------------------------------- handle the last 3 uint32_t's */
  switch(length)                     /* all the case statements fall through */
  { 
  case 3 : c+=k[2];
  case 2 : b+=k[1];
  case 1 : a+=k[0];
    final(a,b,c);
  case 0:     /* case 0: nothing left to add */
    break;
  }
  /*------------------------------------------------------ report the result */
  return c;
}